

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

bool __thiscall
helics::BaseTimeCoordinator::addDependency(BaseTimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  DependencyInfo *pDVar2;
  
  bVar1 = TimeDependencies::addDependency(&this->dependencies,fedID);
  if ((bVar1) && ((this->mSourceId).gid == fedID.gid)) {
    pDVar2 = TimeDependencies::getDependencyInfo(&this->dependencies,fedID);
    if (pDVar2 != (DependencyInfo *)0x0) {
      pDVar2->connection = SELF;
    }
  }
  return bVar1;
}

Assistant:

bool BaseTimeCoordinator::addDependency(GlobalFederateId fedID)
{
    if (dependencies.addDependency(fedID)) {
        if (fedID == mSourceId) {
            auto* dep = dependencies.getDependencyInfo(fedID);
            if (dep != nullptr) {
                dep->connection = ConnectionType::SELF;
            }
        }
        return true;
    }
    return false;
}